

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O0

int duckdb::Sign(uhugeint_t n)

{
  bool bVar1;
  uhugeint_t *in_RSI;
  uhugeint_t *unaff_retaddr;
  uhugeint_t local_20;
  
  uhugeint_t::uhugeint_t(&local_20,0);
  bVar1 = uhugeint_t::operator>(unaff_retaddr,in_RSI);
  return (int)bVar1;
}

Assistant:

int Sign(uhugeint_t n) {
	return (n > 0);
}